

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_i2stat(fitsfile *infptr,int naxis,long *naxes,imgstats *imagestats,int *status)

{
  long *local_218;
  undefined8 local_210;
  double *local_208;
  double *local_200;
  double *local_1f8;
  double *local_1f0;
  double *local_1e8;
  double *local_1e0;
  long local_1d8;
  undefined1 *local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  double local_1a8;
  double noise5;
  double noise3;
  double noise2;
  double noise1;
  double sigma;
  double mean;
  int local_170;
  int checknull;
  int tstatus;
  int anynul;
  short nullvalue;
  short maxvalue;
  void *pvStack_160;
  short minvalue;
  short *intarray;
  long ny;
  long nx;
  long ngood;
  long npix;
  long i2;
  long i1;
  long inc [9];
  long local_d8;
  long lpixel [9];
  long local_88;
  long fpixel [9];
  int *status_local;
  imgstats *imagestats_local;
  long *naxes_local;
  int naxis_local;
  fitsfile *infptr_local;
  
  fpixel[8] = (long)status;
  memcpy(&local_88,&DAT_0010c350,0x48);
  memcpy(&local_d8,&DAT_0010c3a0,0x48);
  memcpy(&i1,&DAT_0010c3f0,0x48);
  mean._4_4_ = 1;
  local_1b8 = *naxes / 2;
  i2 = local_1b8 - (XSAMPLE / 2 + -1);
  local_1b0 = *naxes / 2;
  npix = local_1b0 + XSAMPLE / 2;
  if (i2 < 1) {
    i2 = 1;
  }
  if (*naxes < npix) {
    npix = *naxes;
  }
  local_88 = i2;
  local_d8 = npix;
  ny = (npix - i2) + 1;
  if (1 < naxis) {
    local_1c8 = naxes[1] / 2;
    i2 = local_1c8 - (YSAMPLE / 2 + -1);
    local_1c0 = naxes[1] / 2;
    npix = local_1c0 + YSAMPLE / 2;
    if (i2 < 1) {
      i2 = 1;
    }
    if (naxes[1] < npix) {
      npix = naxes[1];
    }
    fpixel[0] = i2;
    lpixel[0] = npix;
  }
  intarray = (short *)((npix - i2) + 1);
  ngood = ny * (long)intarray;
  if (2 < naxis) {
    fpixel[1] = naxes[2] / 2 + 1;
    lpixel[1] = naxes[2] / 2 + 1;
  }
  pvStack_160 = calloc(ngood,2);
  if (pvStack_160 == (void *)0x0) {
    *(undefined4 *)fpixel[8] = 0x71;
    infptr_local._4_4_ = *(int *)fpixel[8];
  }
  else {
    ffpscl(0x3ff0000000000000,0,infptr,fpixel[8]);
    local_218 = &i1;
    local_200 = (double *)&checknull;
    local_210 = (int *)((ulong)local_210._4_4_ << 0x20);
    local_208 = (double *)pvStack_160;
    local_1f8 = (double *)fpixel[8];
    ffgsvi(infptr,0,naxis,naxes,&local_88,&local_d8);
    local_170 = 0;
    ffgky(infptr,0x15,"BLANK",(long)&tstatus + 2,0,&local_170);
    if (local_170 != 0) {
      tstatus._2_2_ = 0;
      mean._4_4_ = 0;
    }
    local_1d8 = fpixel[8];
    local_1e0 = &local_1a8;
    local_1e8 = &noise5;
    local_1f0 = &noise3;
    local_1f8 = &noise2;
    local_200 = &noise1;
    local_208 = &sigma;
    local_210 = &anynul;
    local_218 = (long *)((long)&anynul + 2);
    local_1d0 = (undefined1 *)&local_218;
    fits_img_stats_short(pvStack_160,ny,intarray,mean._4_4_,(int)tstatus._2_2_,&nx);
    imagestats->n_nulls = (int)ngood - (int)nx;
    imagestats->minval = (double)(int)anynul._2_2_;
    imagestats->maxval = (double)(int)(short)anynul;
    imagestats->mean = sigma;
    imagestats->sigma = noise1;
    imagestats->noise1 = noise2;
    imagestats->noise2 = noise3;
    imagestats->noise3 = noise5;
    imagestats->noise5 = local_1a8;
    free(pvStack_160);
    infptr_local._4_4_ = *(int *)fpixel[8];
  }
  return infptr_local._4_4_;
}

Assistant:

int fp_i2stat(fitsfile *infptr, int naxis, long *naxes, imgstats *imagestats, int *status)
{
/*
    read the central XSAMPLE by YSAMPLE region of pixels in the int*2 image, 
    and then compute basic statistics: min, max, mean, sigma, mean diff, etc.
*/

	long fpixel[9] = {1,1,1,1,1,1,1,1,1};
	long lpixel[9] = {1,1,1,1,1,1,1,1,1};
	long inc[9]    = {1,1,1,1,1,1,1,1,1};
	long i1, i2, npix, ngood, nx, ny;
	short *intarray, minvalue, maxvalue, nullvalue;
	int anynul, tstatus, checknull = 1;
	double mean, sigma, noise1, noise2, noise3, noise5;
	
         /* select the middle XSAMPLE by YSAMPLE area of the image */
	i1 = naxes[0]/2 - (XSAMPLE/2 - 1);
	i2 = naxes[0]/2 + (XSAMPLE/2);
	if (i1 < 1) i1 = 1;
	if (i2 > naxes[0]) i2 = naxes[0];
	fpixel[0] = i1;
	lpixel[0] = i2;
	nx = i2 - i1 +1;

        if (naxis > 1) {
	    i1 = naxes[1]/2 - (YSAMPLE/2 - 1);
	    i2 = naxes[1]/2 + (YSAMPLE/2);
	    if (i1 < 1) i1 = 1;
	    if (i2 > naxes[1]) i2 = naxes[1];
	    fpixel[1] = i1;
	    lpixel[1] = i2;
	}
	ny = i2 - i1 +1;

	npix = nx * ny;

        /* if there are higher dimensions, read the middle plane of the cube */
	if (naxis > 2) {
	    fpixel[2] = naxes[2]/2 + 1;
	    lpixel[2] = naxes[2]/2 + 1;
	}

	intarray = calloc(npix, sizeof(short));
	if (!intarray) {
		*status = MEMORY_ALLOCATION;
		return(*status);
	}

	/* turn off any scaling of the integer pixel values */
	fits_set_bscale(infptr, 1.0, 0.0, status);

	fits_read_subset_sht(infptr, 0, naxis, naxes, fpixel, lpixel, inc,
	    0, intarray, &anynul, status);

	/* read the null value keyword (BLANK) if present */
	tstatus = 0;
	fits_read_key(infptr, TSHORT, "BLANK", &nullvalue, 0, &tstatus);
	if (tstatus) {
	   nullvalue = 0;
	   checknull = 0;
	}

	/* compute statistics of the image */

        fits_img_stats_short(intarray, nx, ny, checknull, nullvalue, 
	&ngood, &minvalue, &maxvalue, &mean, &sigma, &noise1, &noise2, &noise3, &noise5, status);

	imagestats->n_nulls = npix - ngood;
	imagestats->minval = minvalue;
	imagestats->maxval = maxvalue; 
	imagestats->mean = mean; 
	imagestats->sigma = sigma; 
	imagestats->noise1 = noise1; 
	imagestats->noise2 = noise2; 
	imagestats->noise3 = noise3; 
	imagestats->noise5 = noise5; 
    
	free(intarray);
	return(*status);
}